

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

UText * utext_clone_63(UText *dest,UText *src,UBool deep,UBool readOnly,UErrorCode *status)

{
  UText *pUVar1;
  
  if (U_ZERO_ERROR < *status) {
    return dest;
  }
  pUVar1 = (*src->pFuncs->clone)(dest,src,deep,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (pUVar1 == (UText *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else if (readOnly != '\0') {
      *(byte *)&pUVar1->providerProperties = (byte)pUVar1->providerProperties & 0xf7;
    }
  }
  return pUVar1;
}

Assistant:

U_CAPI UText * U_EXPORT2
utext_clone(UText *dest, const UText *src, UBool deep, UBool readOnly, UErrorCode *status) {
    if (U_FAILURE(*status)) {
        return dest;
    }
    UText *result = src->pFuncs->clone(dest, src, deep, status);
    if (U_FAILURE(*status)) {
        return result;
    }
    if (result == NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return result;
    }
    if (readOnly) {
        utext_freeze(result);
    }
    return result;
}